

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_time.h
# Opt level: O1

uint64_t stm_round_to_common_refresh_rate(uint64_t ticks)

{
  uint64_t uVar1;
  bool bVar2;
  uint uVar3;
  bool bVar4;
  
  uVar3 = 0;
  do {
    uVar1 = _stm_refresh_rates[uVar3][0];
    if (uVar1 == 0) {
      return ticks;
    }
    bVar4 = ticks <= uVar1 - _stm_refresh_rates[uVar3][1];
    bVar2 = _stm_refresh_rates[uVar3][1] + uVar1 <= ticks;
    uVar3 = uVar3 + (bVar2 || bVar4);
  } while (bVar2 || bVar4);
  return uVar1;
}

Assistant:

SOKOL_API_IMPL uint64_t stm_round_to_common_refresh_rate(uint64_t ticks) {
    uint64_t ns;
    int i = 0;
    while (0 != (ns = _stm_refresh_rates[i][0])) {
        uint64_t tol = _stm_refresh_rates[i][1];
        if ((ticks > (ns - tol)) && (ticks < (ns + tol))) {
            return ns;
        }
        i++;
    }
    // fallthough: didn't fit into any buckets
    return ticks;
}